

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

variable_order_t * __thiscall
merlin::graphical_model::order2
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  pointer *this_00;
  index iVar1;
  const_iterator ci_00;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  variable_set *pvVar5;
  reference pvVar6;
  reference puVar7;
  size_type sVar8;
  reference pvVar9;
  my_set<merlin::edge_id> *pmVar10;
  _Self *__x;
  unsigned_long *puVar11;
  pointer peVar12;
  reference puVar13;
  variable vVar14;
  reference rVar15;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar16;
  size_t v_3;
  _Self local_4d0;
  const_iterator it_2;
  size_t j_3;
  size_t i_5;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_4a0;
  const_iterator ci_3;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_488;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_480;
  const_iterator ci_2;
  my_set<merlin::edge_id> *temp_1;
  size_t v_2;
  _Self local_460;
  const_iterator it_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> to_fix;
  size_t j_2;
  size_t i_4;
  _Self local_408;
  _Base_ptr local_400;
  _Rb_tree_const_iterator<unsigned_long> local_3f8;
  iterator it2;
  iterator it1;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_3d8;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_3d0;
  const_iterator ci_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> neighbors;
  my_set<merlin::edge_id> nlist;
  size_t cand;
  reference local_368;
  index local_358;
  size_t j_1;
  size_t i_3;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_340;
  const_iterator ci;
  undefined1 local_330 [8];
  my_set<merlin::edge_id> temp;
  size_t v_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_300;
  iterator it;
  value_type_conflict local_2f0;
  value_type_conflict local_2e8;
  int local_2dc;
  _Self _Stack_2d8;
  int v;
  iterator si;
  _Rb_tree_const_iterator<unsigned_long> local_2b0;
  iterator stop;
  iterator start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> simplicial;
  vector<unsigned_long,_std::allocator<unsigned_long>_> candidates;
  size_t width;
  int local_260;
  int num_nodes;
  int min_score;
  size_t i_2;
  undefined1 local_248 [8];
  vector<int,_std::allocator<int>_> scores;
  reference local_210;
  value_type_conflict local_200;
  size_t i_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> map_vars;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> sum_vars;
  size_t n;
  size_t local_188;
  size_t local_180;
  size_t j;
  variable_set *pvStack_170;
  size_t local_168;
  size_t sStack_160;
  undefined1 local_158 [8];
  const_iterator vi;
  variable_set *vs;
  size_t i;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  undefined1 local_100 [8];
  graph G;
  vector<bool,_std::allocator<bool>_> *var_types_local;
  graphical_model *this_local;
  OrderMethod ord_type_local;
  variable_order_t *order;
  
  G.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  sVar4 = nvar(this);
  graph::graph((graph *)local_100,sVar4);
  mrf((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i,this);
  for (vs = (variable_set *)0x0; pvVar5 = (variable_set *)nvar(this), vs < pvVar5;
      vs = (variable_set *)
           ((long)&(vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1)) {
    vi.m_tmp.m_states =
         (size_t)std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                 operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                            &i,(size_type)vs);
    variable_set::begin((const_iterator *)local_158,(variable_set *)vi.m_tmp.m_states);
    while( true ) {
      variable_set::end((const_iterator *)&j,(variable_set *)vi.m_tmp.m_states);
      ci_00.m_vs = pvStack_170;
      ci_00.m_i = j;
      ci_00.m_tmp.m_label = local_168;
      ci_00.m_tmp.m_states = sStack_160;
      bVar2 = variable_set::const_iterator::operator!=((const_iterator *)local_158,ci_00);
      if (!bVar2) break;
      vVar14 = variable_set::const_iterator::operator*((const_iterator *)local_158);
      local_188 = vVar14.m_states;
      n = vVar14.m_label;
      local_180 = _vindex(this,(variable *)&n);
      graph::add_edge((graph *)local_100,(index)vs,local_180);
      variable_set::const_iterator::operator++((const_iterator *)local_158);
    }
  }
  sVar4 = nvar(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,sVar4);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&i_1);
  for (local_200 = 0; local_200 < sVar4; local_200 = local_200 + 1) {
    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](var_types,local_200);
    local_210 = rVar15;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_210);
    if (bVar2) {
      pVar16 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&i_1,&local_200);
      scores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)pVar16.first._M_node;
    }
    else {
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_200);
    }
  }
  std::allocator<int>::allocator((allocator<int> *)((long)&i_2 + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_248,sVar4,(allocator<int> *)((long)&i_2 + 7)
            );
  std::allocator<int>::~allocator((allocator<int> *)((long)&i_2 + 7));
  for (_min_score = 0; _min_score < sVar4; _min_score = _min_score + 1) {
    iVar3 = order_score(this,(graph *)local_100,_min_score,ord_type);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_248,_min_score);
    *pvVar6 = iVar3;
  }
  width._4_4_ = (int)sVar4;
  candidates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    if (width._4_4_ == 0) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &simplicial.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start);
    local_260 = std::numeric_limits<int>::max();
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&stop);
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&local_2b0);
    bVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::empty
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar2) {
      stop = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &i_1);
      si = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&i_1);
      local_2b0._M_node = si._M_node;
    }
    else {
      stop = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_2b0._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    _Stack_2d8._M_node = stop._M_node;
    while( true ) {
      bVar2 = std::operator!=(&stack0xfffffffffffffd28,&local_2b0);
      if (!bVar2) break;
      puVar13 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&stack0xfffffffffffffd28);
      local_2dc = (int)*puVar13;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_248,(long)local_2dc);
      if (*pvVar6 == 0) {
        local_2e8 = (value_type_conflict)local_2dc;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start,&local_2e8);
      }
      else {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_248,(long)local_2dc);
        if (*pvVar6 < local_260) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_248,(long)local_2dc);
          local_260 = *pvVar6;
          this_00 = &simplicial.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
          local_2f0 = (value_type_conflict)local_2dc;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_2f0);
        }
        else {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_248,(long)local_2dc);
          if (*pvVar6 == local_260) {
            it._M_current = (unsigned_long *)(long)local_2dc;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &simplicial.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (value_type_conflict *)&it);
          }
        }
      }
      std::_Rb_tree_const_iterator<unsigned_long>::operator++(&stack0xfffffffffffffd28);
    }
    local_300._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start);
    while( true ) {
      v_1 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start);
      bVar2 = __gnu_cxx::operator!=
                        (&local_300,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&v_1);
      if (!bVar2) break;
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_300);
      temp.super_my_vector<merlin::edge_id>.m_n = *puVar7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (__return_storage_ptr__,&temp.super_my_vector<merlin::edge_id>.m_n);
      width._4_4_ = width._4_4_ + -1;
      pmVar10 = graph::neighbors((graph *)local_100,temp.super_my_vector<merlin::edge_id>.m_n);
      my_set<merlin::edge_id>::my_set((my_set<merlin::edge_id> *)local_330,pmVar10);
      ci._M_current = (edge_id *)my_set<merlin::edge_id>::size((my_set<merlin::edge_id> *)local_330)
      ;
      puVar11 = std::max<unsigned_long>
                          ((unsigned_long *)
                           &candidates.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(unsigned_long *)&ci);
      candidates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar11;
      local_340._M_current =
           (edge_id *)my_set<merlin::edge_id>::begin((my_set<merlin::edge_id> *)local_330);
      while( true ) {
        i_3 = (size_t)my_set<merlin::edge_id>::end((my_set<merlin::edge_id> *)local_330);
        bVar2 = __gnu_cxx::operator!=
                          (&local_340,
                           (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                            *)&i_3);
        if (!bVar2) break;
        peVar12 = __gnu_cxx::
                  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                  ::operator->(&local_340);
        j_1 = peVar12->first;
        peVar12 = __gnu_cxx::
                  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                  ::operator->(&local_340);
        local_358 = peVar12->second;
        graph::remove_edge((graph *)local_100,j_1,local_358);
        __gnu_cxx::
        __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
        ::operator++(&local_340);
      }
      graph::remove_node((graph *)local_100,temp.super_my_vector<merlin::edge_id>.m_n);
      iVar3 = std::numeric_limits<int>::max();
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_248,
                          temp.super_my_vector<merlin::edge_id>.m_n);
      *pvVar6 = iVar3;
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (var_types,temp.super_my_vector<merlin::edge_id>.m_n);
      local_368 = rVar15;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_368);
      if (bVar2) {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &i_1,&temp.super_my_vector<merlin::edge_id>.m_n);
      }
      else {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &temp.super_my_vector<merlin::edge_id>.m_n);
      }
      my_set<merlin::edge_id>::~my_set((my_set<merlin::edge_id> *)local_330);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_300);
    }
    iVar3 = std::numeric_limits<int>::max();
    if (local_260 == iVar3) {
      cand._4_4_ = 0xf;
    }
    else {
      sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &simplicial.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      iVar3 = randi2((int)sVar8);
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &simplicial.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)iVar3);
      nlist.super_my_vector<merlin::edge_id>.m_n = *pvVar9;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (__return_storage_ptr__,&nlist.super_my_vector<merlin::edge_id>.m_n);
      width._4_4_ = width._4_4_ + -1;
      pmVar10 = graph::neighbors((graph *)local_100,nlist.super_my_vector<merlin::edge_id>.m_n);
      my_set<merlin::edge_id>::my_set
                ((my_set<merlin::edge_id> *)
                 &neighbors._M_t._M_impl.super__Rb_tree_header._M_node_count,pmVar10);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &ci_1);
      local_3d0._M_current =
           (edge_id *)
           my_set<merlin::edge_id>::begin
                     ((my_set<merlin::edge_id> *)
                      &neighbors._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        local_3d8._M_current =
             (edge_id *)
             my_set<merlin::edge_id>::end
                       ((my_set<merlin::edge_id> *)
                        &neighbors._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar2 = __gnu_cxx::operator!=(&local_3d0,&local_3d8);
        if (!bVar2) break;
        peVar12 = __gnu_cxx::
                  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                  ::operator->(&local_3d0);
        if (peVar12->first == nlist.super_my_vector<merlin::edge_id>.m_n) {
          peVar12 = __gnu_cxx::
                    __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                    ::operator->(&local_3d0);
          if (peVar12->second != nlist.super_my_vector<merlin::edge_id>.m_n) {
            peVar12 = __gnu_cxx::
                      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                      ::operator->(&local_3d0);
            std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &ci_1,&peVar12->second);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
        ::operator++(&local_3d0);
      }
      std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&it2);
      std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&local_3f8);
      local_400 = (_Base_ptr)
                  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&ci_1);
      it2 = (iterator)local_400;
      while( true ) {
        local_408._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                       ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&ci_1);
        bVar2 = std::operator!=(&it2,&local_408);
        if (!bVar2) break;
        local_3f8._M_node = it2._M_node;
        while( true ) {
          __x = std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_3f8);
          i_4 = (size_t)std::
                        set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)&ci_1);
          bVar2 = std::operator!=(__x,(_Self *)&i_4);
          if (!bVar2) break;
          puVar13 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&it2);
          iVar1 = *puVar13;
          puVar13 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_3f8);
          graph::add_edge((graph *)local_100,iVar1,*puVar13);
        }
        std::_Rb_tree_const_iterator<unsigned_long>::operator++(&it2);
      }
      to_fix._M_t._M_impl.super__Rb_tree_header._M_node_count =
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&ci_1);
      puVar11 = std::max<unsigned_long>
                          ((unsigned_long *)
                           &candidates.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           &to_fix._M_t._M_impl.super__Rb_tree_header._M_node_count);
      candidates.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar11;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &it_1,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&ci_1);
      local_460._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&ci_1);
      while( true ) {
        v_2 = (size_t)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&ci_1);
        bVar2 = std::operator!=(&local_460,(_Self *)&v_2);
        if (!bVar2) break;
        puVar13 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_460);
        iVar1 = *puVar13;
        ci_2._M_current = (edge_id *)graph::neighbors((graph *)local_100,iVar1);
        local_480._M_current =
             (edge_id *)my_set<merlin::edge_id>::begin((my_set<merlin::edge_id> *)ci_2._M_current);
        while( true ) {
          local_488._M_current = (edge_id *)my_set<merlin::edge_id>::end(ci_2._M_current);
          bVar2 = __gnu_cxx::operator!=(&local_480,&local_488);
          if (!bVar2) break;
          peVar12 = __gnu_cxx::
                    __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                    ::operator->(&local_480);
          if (peVar12->first == iVar1) {
            peVar12 = __gnu_cxx::
                      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                      ::operator->(&local_480);
            if (iVar1 != peVar12->second) {
              peVar12 = __gnu_cxx::
                        __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                        ::operator->(&local_480);
              pVar16 = std::
                       set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&it_1,&peVar12->second);
              ci_3._M_current = (edge_id *)pVar16.first._M_node;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
          ::operator++(&local_480);
        }
        std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_460);
      }
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &it_1,&nlist.super_my_vector<merlin::edge_id>.m_n);
      local_4a0._M_current =
           (edge_id *)
           my_set<merlin::edge_id>::begin
                     ((my_set<merlin::edge_id> *)
                      &neighbors._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        i_5 = (size_t)my_set<merlin::edge_id>::end
                                ((my_set<merlin::edge_id> *)
                                 &neighbors._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar2 = __gnu_cxx::operator!=
                          (&local_4a0,
                           (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                            *)&i_5);
        if (!bVar2) break;
        peVar12 = __gnu_cxx::
                  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                  ::operator->(&local_4a0);
        iVar1 = peVar12->first;
        peVar12 = __gnu_cxx::
                  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                  ::operator->(&local_4a0);
        graph::remove_edge((graph *)local_100,iVar1,peVar12->second);
        __gnu_cxx::
        __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
        ::operator++(&local_4a0);
      }
      graph::remove_node((graph *)local_100,nlist.super_my_vector<merlin::edge_id>.m_n);
      iVar3 = std::numeric_limits<int>::max();
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_248,
                          nlist.super_my_vector<merlin::edge_id>.m_n);
      *pvVar6 = iVar3;
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (var_types,nlist.super_my_vector<merlin::edge_id>.m_n);
      it_2._M_node = (_Base_ptr)rVar15._M_p;
      bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&it_2);
      if (bVar2) {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &i_1,&nlist.super_my_vector<merlin::edge_id>.m_n);
      }
      else {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &nlist.super_my_vector<merlin::edge_id>.m_n);
      }
      local_4d0._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&it_1);
      while( true ) {
        v_3 = (size_t)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&it_1);
        bVar2 = std::operator!=(&local_4d0,(_Self *)&v_3);
        if (!bVar2) break;
        puVar13 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_4d0);
        sVar8 = *puVar13;
        iVar3 = order_score(this,(graph *)local_100,sVar8,ord_type);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_248,sVar8);
        *pvVar6 = iVar3;
        std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_4d0);
      }
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &it_1);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &ci_1);
      my_set<merlin::edge_id>::~my_set
                ((my_set<merlin::edge_id> *)
                 &neighbors._M_t._M_impl.super__Rb_tree_header._M_node_count);
      cand._4_4_ = 0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &simplicial.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  } while (cand._4_4_ == 0);
  G.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_248);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&i_1);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &map_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector
            ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i);
  graph::~graph((graph *)local_100);
  if ((G.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node._7_1_ & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

variable_order_t order2(OrderMethod ord_type, std::vector<bool> var_types) const {

		// variable order to be computed
		variable_order_t order;

		// create a temporary graph
		graph G(nvar());
		std::vector<variable_set> adj = mrf();
		for (size_t i = 0; i < nvar(); ++i) {
			variable_set& vs = adj[i];
			for (variable_set::const_iterator vi = vs.begin();
					vi != vs.end(); ++vi) {
				size_t j = _vindex(*vi);
				G.add_edge(i, j);
			}
		}

		// reserve space for the order
		size_t n = nvar();
		order.reserve(n);

		// identify SUM and MAP variables
		std::set<size_t> sum_vars, map_vars;
		for (size_t i = 0; i < n; ++i) {
			if (var_types[i] == false) sum_vars.insert(i);
			else map_vars.insert(i);
		}

		// keeps track of node scores
		std::vector<int> scores(n);
		for (size_t i = 0; i < n; ++i) {
			scores[i] = order_score(G, i, ord_type);
		}

		// eliminate nodes until all gone
		int min_score = -1, num_nodes = n;
		size_t width = 0;
		while (num_nodes != 0) {

			// keeps track of minimal score nodes
			std::vector<size_t> candidates; // minimal score of 1 or higher
			std::vector<size_t> simplicial; // simplicial nodes (score 0)

			min_score = std::numeric_limits<int>::max();

			// check if there are SUM vars left to eliminate
			std::set<size_t>::iterator start, stop;
			if (sum_vars.empty() == false) { // yes
				start = sum_vars.begin();
				stop = sum_vars.end();
			} else { // done, move to MAP vars
				start = map_vars.begin();
				stop = map_vars.end();
			}
			for (std::set<size_t>::iterator si = start; si != stop; ++si) {
				int v = *si;
				if (scores[v] == 0) { // score 0
					simplicial.push_back(v);
				} else if (scores[v] < min_score) { // new, lower score (but greater 0)
					min_score = scores[v];
					candidates.clear();
					candidates.push_back(v);
				} else if (scores[v] == min_score) { // current min. found again
					candidates.push_back(v);
				}
			}

			// eliminate all nodes with score=0 -> no edges will have to be added
			for (std::vector<size_t>::iterator it = simplicial.begin();
					it != simplicial.end(); ++it) {
				size_t v = (*it);
				order.push_back(v);
				--num_nodes;
				my_set<edge_id> temp = G.neighbors(v);
				width = std::max(width, temp.size());
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					G.remove_edge(i, j);
				}
				G.remove_node(v); // and adj edges
				scores[v] = std::numeric_limits<int>::max();
				if (var_types[v] == false) sum_vars.erase(v);
				else map_vars.erase(v);
			}

			// anything left to eliminate? If not, we are done!
			if (min_score == std::numeric_limits<int>::max()) {
				break;
			}

			// Pick one of the minimal score nodes (with score >= 1),
			// breaking ties randomly
			size_t cand = candidates[randi2(candidates.size())];
			//size_t cand = candidates[0]; // first candidate in list (lexicograhically)
			order.push_back(cand);
			--num_nodes;

			// remember it's neighbors, to be used later
			my_set<edge_id> nlist = G.neighbors(cand);
			std::set<size_t> neighbors;
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				if (ci->first == cand && ci->second != cand)
					neighbors.insert(ci->second);
			}

			// connect neighbors in primal graph
			std::set<size_t>::iterator it1, it2;
			for (it1 = neighbors.begin(); it1 != neighbors.end(); ++it1) {
				it2 = it1;
				while (++it2 != neighbors.end()) {
					size_t i = *it1, j = *it2;
					G.add_edge(i, j);
				}
			}

			// compute candidates for score update (node's neighbors and their neighbors)
			width = std::max(width, neighbors.size());
			std::set<size_t> to_fix(neighbors);
			for (std::set<size_t>::const_iterator it = neighbors.begin();
					it != neighbors.end(); ++it) {
				size_t v = (*it);
				const my_set<edge_id>& temp = G.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					if (ci->first == v && v != ci->second)
						to_fix.insert(ci->second);
				}
			}
			to_fix.erase(cand);

			// remove node from primal graph
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				size_t i = ci->first, j = ci->second;
				G.remove_edge(i, j);
			}
			G.remove_node(cand); // and adj edges
			scores[cand] = std::numeric_limits<int>::max(); // tag score
			if (var_types[cand] == false) sum_vars.erase(cand);
			else map_vars.erase(cand);

			// update scores in primal graph (candidate nodes computed earlier)
			for (std::set<size_t>::const_iterator it = to_fix.begin();
					it != to_fix.end(); ++it) {
				size_t v = (*it);
				scores[v] = order_score(G, v, ord_type);
			}
		}

		return order;
	}